

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O1

int Mvc_CoverIsOneLiteral(Mvc_Cover_t *pCover)

{
  bool bVar1;
  int iVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  
  iVar2 = Mvc_CoverReadCubeNum(pCover);
  if (iVar2 == 1) {
    pMVar3 = Mvc_CoverReadCubeHead(pCover);
    iVar2 = 1;
    if (0 < pCover->nBits) {
      bVar1 = false;
      uVar4 = 0;
      do {
        if ((pMVar3->pData[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
          if (bVar1) goto LAB_004226b7;
          bVar1 = true;
        }
        uVar4 = uVar4 + 1;
      } while (pCover->nBits != uVar4);
    }
  }
  else {
LAB_004226b7:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Mvc_CoverIsOneLiteral( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Counter, Value;
    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;
    pCube = Mvc_CoverReadCubeHead(pCover);
    // count literals
    Counter = 0;
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
    {
        if ( Value )
        {
            if ( Counter++ )
                return 0;
        }
    }
    return 1;
}